

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O1

bool __thiscall duckdb::Pipeline::GetProgress(Pipeline *this,ProgressData *progress)

{
  ulong uVar1;
  ClientContext *pCVar2;
  PhysicalOperator *pPVar3;
  _func_int **pp_Var4;
  bool bVar5;
  type pGVar6;
  type pGVar7;
  ulong uVar8;
  long lVar9;
  undefined8 in_R9;
  double local_48;
  double dStack_40;
  bool local_38;
  
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&this->source);
  uVar1 = ((this->source).ptr)->estimated_cardinality;
  uVar8 = 0x1000000000000;
  if (uVar1 < 0x1000000000000) {
    uVar8 = uVar1;
  }
  lVar9 = uVar8 + (uVar8 == 0);
  if (((this->initialized)._M_base._M_i & 1U) == 0) {
    progress->done = 0.0;
    progress->total = (double)lVar9;
    bVar5 = true;
  }
  else {
    pCVar2 = this->executor->context;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&this->source);
    pPVar3 = (this->source).ptr;
    pGVar6 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator*(&this->source_state);
    (*pPVar3->_vptr_PhysicalOperator[0x17])(&local_48,pPVar3,pCVar2,pGVar6);
    progress->invalid = local_38;
    progress->done = local_48;
    progress->total = dStack_40;
    ProgressData::Normalize(progress,(double)lVar9);
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&this->sink);
    pPVar3 = (this->sink).ptr;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&this->sink);
    pGVar7 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&((this->sink).ptr)->sink_state);
    pp_Var4 = pPVar3->_vptr_PhysicalOperator;
    (*pp_Var4[0x18])(&local_48,pPVar3,pCVar2,pGVar7,pp_Var4,in_R9,*(undefined4 *)&progress->done,
                     *(undefined4 *)&progress->total,*(undefined8 *)&progress->invalid);
    progress->invalid = local_38;
    progress->done = local_48;
    progress->total = dStack_40;
    if (((progress->invalid != false) || (progress->done < 0.0)) ||
       (progress->total < progress->done)) {
      bVar5 = false;
    }
    else {
      bVar5 = 0.0 <= progress->total;
    }
  }
  return bVar5;
}

Assistant:

bool Pipeline::GetProgress(ProgressData &progress) {
	D_ASSERT(source);
	idx_t source_cardinality = MinValue<idx_t>(source->estimated_cardinality, 1ULL << 48ULL);
	if (source_cardinality < 1) {
		source_cardinality = 1;
	}
	if (!initialized) {
		progress.done = 0;
		progress.total = double(source_cardinality);
		return true;
	}
	auto &client = executor.context;

	progress = source->GetProgress(client, *source_state);
	progress.Normalize(double(source_cardinality));
	progress = sink->GetSinkProgress(client, *sink->sink_state, progress);
	return progress.IsValid();
}